

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv2_gears.c
# Opt level: O0

void transpose(float *a)

{
  float local_58;
  float local_54;
  float m [16];
  float *a_local;
  
  local_58 = *a;
  local_54 = a[4];
  m[0] = a[8];
  m[1] = a[0xc];
  m[2] = a[1];
  m[3] = a[5];
  m[4] = a[9];
  m[5] = a[0xd];
  m[6] = a[2];
  m[7] = a[6];
  m[8] = a[10];
  m[9] = a[0xe];
  m[10] = a[3];
  m[0xb] = a[7];
  m[0xc] = a[0xb];
  m[0xd] = a[0xf];
  memcpy(a,&local_58,0x40);
  return;
}

Assistant:

static void transpose(float *a)
{
  float m[16] = {
    a[0], a[4], a[8],  a[12],
    a[1], a[5], a[9],  a[13],
    a[2], a[6], a[10], a[14],
    a[3], a[7], a[11], a[15]
  };

  memcpy(a, m, sizeof(m));
}